

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gmock-spec-builders.h
# Opt level: O0

TypedExpectation<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
* __thiscall
testing::internal::
FunctionMocker<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
::FindMatchingExpectationLocked
          (FunctionMocker<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
           *this,ArgumentTuple *args)

{
  bool bVar1;
  __shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2> *this_00;
  TypedExpectation<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_01;
  TypedExpectation<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *exp;
  const_reverse_iterator it;
  ArgumentTuple *args_local;
  FunctionMocker<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
  *this_local;
  
  it.current._M_current =
       (__normal_iterator<const_std::shared_ptr<testing::internal::ExpectationBase>_*,_std::vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>_>
        )(__normal_iterator<const_std::shared_ptr<testing::internal::ExpectationBase>_*,_std::vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>_>
          )args;
  MutexBase::AssertHeld((MutexBase *)g_gmock_mutex);
  std::
  vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
  ::rbegin((vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
            *)&stack0xffffffffffffffd8);
  while( true ) {
    std::
    vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
    ::rend((vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>
            *)&exp);
    bVar1 = std::operator!=((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::shared_ptr<testing::internal::ExpectationBase>_*,_std::vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>_>_>
                             *)&stack0xffffffffffffffd8,
                            (reverse_iterator<__gnu_cxx::__normal_iterator<const_std::shared_ptr<testing::internal::ExpectationBase>_*,_std::vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>_>_>
                             *)&exp);
    if (!bVar1) {
      return (TypedExpectation<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
              *)0x0;
    }
    this_00 = &std::
               reverse_iterator<__gnu_cxx::__normal_iterator<const_std::shared_ptr<testing::internal::ExpectationBase>_*,_std::vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>_>_>
               ::operator->((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::shared_ptr<testing::internal::ExpectationBase>_*,_std::vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>_>_>
                             *)&stack0xffffffffffffffd8)->
               super___shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>;
    this_01 = (TypedExpectation<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
               *)std::__shared_ptr<testing::internal::ExpectationBase,_(__gnu_cxx::_Lock_policy)2>::
                 get(this_00);
    bVar1 = TypedExpectation<void_(std::__cxx11::basic_ostringstream<char,_std::char_traits<char>,_std::allocator<char>_>_&)>
            ::ShouldHandleArguments(this_01,(ArgumentTuple *)it.current._M_current);
    if (bVar1) break;
    std::
    reverse_iterator<__gnu_cxx::__normal_iterator<const_std::shared_ptr<testing::internal::ExpectationBase>_*,_std::vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>_>_>
    ::operator++((reverse_iterator<__gnu_cxx::__normal_iterator<const_std::shared_ptr<testing::internal::ExpectationBase>_*,_std::vector<std::shared_ptr<testing::internal::ExpectationBase>,_std::allocator<std::shared_ptr<testing::internal::ExpectationBase>_>_>_>_>
                  *)&stack0xffffffffffffffd8);
  }
  return this_01;
}

Assistant:

GTEST_EXCLUSIVE_LOCK_REQUIRED_(g_gmock_mutex) {
    g_gmock_mutex.AssertHeld();
    // See the definition of untyped_expectations_ for why access to
    // it is unprotected here.
    for (typename UntypedExpectations::const_reverse_iterator it =
             untyped_expectations_.rbegin();
         it != untyped_expectations_.rend(); ++it) {
      TypedExpectation<F>* const exp =
          static_cast<TypedExpectation<F>*>(it->get());
      if (exp->ShouldHandleArguments(args)) {
        return exp;
      }
    }
    return nullptr;
  }